

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O2

PLYValue * gvr::anon_unknown_3::createValue(ply_type type,ply_encoding encoding)

{
  char cVar1;
  PLYValue *pPVar2;
  undefined **ppuVar3;
  
  if (encoding != ply_little_endian) {
    if (encoding != ply_big_endian) {
      if (encoding != ply_ascii) {
        return (PLYValue *)0x0;
      }
      if (ply_float64 < type) {
        return (PLYValue *)0x0;
      }
      if ((0x2aU >> (type & 0x1f) & 1) != 0) {
        pPVar2 = (PLYValue *)operator_new(0x10);
        ppuVar3 = &PTR__PLYValue_00130ce8;
        goto LAB_0011365c;
      }
      if ((0x54U >> (type & 0x1f) & 1) != 0) {
        pPVar2 = (PLYValue *)operator_new(0x10);
        ppuVar3 = &PTR__PLYValue_00130d78;
        goto LAB_0011365c;
      }
      if ((0x180U >> (type & 0x1f) & 1) == 0) {
        return (PLYValue *)0x0;
      }
      pPVar2 = (PLYValue *)operator_new(0x10);
      ppuVar3 = &PTR__PLYValue_00130e08;
      goto LAB_001135fa;
    }
    switch(type) {
    case ply_int8:
      goto switchD_001134c8_caseD_1;
    case ply_uint8:
      goto switchD_001134c8_caseD_2;
    case ply_int16:
      pPVar2 = (PLYValue *)operator_new(0x10);
      ppuVar3 = &PTR__PLYValue_00130fb8;
      break;
    case ply_uint16:
      pPVar2 = (PLYValue *)operator_new(0x10);
      ppuVar3 = &PTR__PLYValue_00131048;
      break;
    case ply_int32:
      pPVar2 = (PLYValue *)operator_new(0x10);
      ppuVar3 = &PTR__PLYValue_001310d8;
      goto LAB_0011365c;
    case ply_uint32:
      pPVar2 = (PLYValue *)operator_new(0x10);
      ppuVar3 = &PTR__PLYValue_00131168;
      goto LAB_0011365c;
    case ply_float32:
      cVar1 = gutil::isMSBFirst();
      pPVar2 = (PLYValue *)operator_new(0x10);
      if (cVar1 != '\0') goto LAB_00113628;
      goto LAB_00113655;
    case ply_float64:
      cVar1 = gutil::isMSBFirst();
      pPVar2 = (PLYValue *)operator_new(0x10);
      if (cVar1 != '\0') goto LAB_001135bb;
      goto LAB_001135f3;
    default:
      goto LAB_00113663;
    }
    goto LAB_001135d3;
  }
  switch(type) {
  case ply_int8:
switchD_001134c8_caseD_1:
    pPVar2 = (PLYValue *)operator_new(0x10);
    ppuVar3 = &PTR__PLYValue_00130e98;
LAB_00113552:
    pPVar2->_vptr_PLYValue = (_func_int **)ppuVar3;
    *(undefined1 *)&pPVar2[1]._vptr_PLYValue = 0;
    return pPVar2;
  case ply_uint8:
switchD_001134c8_caseD_2:
    pPVar2 = (PLYValue *)operator_new(0x10);
    ppuVar3 = &PTR__PLYValue_00130f28;
    goto LAB_00113552;
  case ply_int16:
    pPVar2 = (PLYValue *)operator_new(0x10);
    ppuVar3 = &PTR__PLYValue_00131438;
    goto LAB_001135d3;
  case ply_uint16:
    pPVar2 = (PLYValue *)operator_new(0x10);
    ppuVar3 = &PTR__PLYValue_001314c8;
LAB_001135d3:
    pPVar2->_vptr_PLYValue = (_func_int **)ppuVar3;
    *(undefined2 *)&pPVar2[1]._vptr_PLYValue = 0;
    return pPVar2;
  case ply_int32:
    pPVar2 = (PLYValue *)operator_new(0x10);
    ppuVar3 = &PTR__PLYValue_00131558;
    break;
  case ply_uint32:
    pPVar2 = (PLYValue *)operator_new(0x10);
    ppuVar3 = &PTR__PLYValue_001315e8;
    break;
  case ply_float32:
    cVar1 = gutil::isMSBFirst();
    pPVar2 = (PLYValue *)operator_new(0x10);
    if (cVar1 == '\0') {
LAB_00113628:
      ppuVar3 = &PTR__PLYValue_001311f8;
      break;
    }
LAB_00113655:
    ppuVar3 = &PTR__PLYValue_00131288;
    break;
  case ply_float64:
    cVar1 = gutil::isMSBFirst();
    pPVar2 = (PLYValue *)operator_new(0x10);
    if (cVar1 == '\0') {
LAB_001135bb:
      ppuVar3 = &PTR__PLYValue_00131318;
      goto LAB_001135fa;
    }
LAB_001135f3:
    ppuVar3 = &PTR__PLYValue_001313a8;
LAB_001135fa:
    pPVar2->_vptr_PLYValue = (_func_int **)ppuVar3;
    pPVar2[1]._vptr_PLYValue = (_func_int **)0x0;
    return pPVar2;
  default:
LAB_00113663:
    return (PLYValue *)0x0;
  }
LAB_0011365c:
  pPVar2->_vptr_PLYValue = (_func_int **)ppuVar3;
  *(undefined4 *)&pPVar2[1]._vptr_PLYValue = 0;
  return pPVar2;
}

Assistant:

PLYValue *createValue(ply_type type, ply_encoding encoding)
{
  if (encoding == ply_ascii)
  {
    switch (type)
    {
      case ply_int8:
      case ply_int16:
      case ply_int32:
        return new PLYValueASCIIInt();

      case ply_uint8:
      case ply_uint16:
      case ply_uint32:
        return new PLYValueASCIIUInt();

      case ply_float32:
      case ply_float64:
        return new PLYValueASCIIDouble();

      default:
        break;
    }
  }
  else if (encoding == ply_big_endian)
  {
    switch (type)
    {
      case ply_int8:
        return new PLYValueInt8();

      case ply_uint8:
        return new PLYValueUInt8();

      case ply_int16:
        return new PLYValueBigInt16();

      case ply_uint16:
        return new PLYValueBigUInt16();

      case ply_int32:
        return new PLYValueBigInt32();

      case ply_uint32:
        return new PLYValueBigUInt32();

      case ply_float32:
        if (gutil::isMSBFirst())
        {
          return new PLYValueFloat32();
        }
        else
        {
          return new PLYValueSwapFloat32();
        }

      case ply_float64:
        if (gutil::isMSBFirst())
        {
          return new PLYValueFloat64();
        }
        else
        {
          return new PLYValueSwapFloat64();
        }

      default:
        break;
    }
  }
  else if (encoding == ply_little_endian)
  {
    switch (type)
    {
      case ply_int8:
        return new PLYValueInt8();

      case ply_uint8:
        return new PLYValueUInt8();

      case ply_int16:
        return new PLYValueLittleInt16();

      case ply_uint16:
        return new PLYValueLittleUInt16();

      case ply_int32:
        return new PLYValueLittleInt32();

      case ply_uint32:
        return new PLYValueLittleUInt32();

      case ply_float32:
        if (gutil::isMSBFirst())
        {
          return new PLYValueSwapFloat32();
        }
        else
        {
          return new PLYValueFloat32();
        }

      case ply_float64:
        if (gutil::isMSBFirst())
        {
          return new PLYValueSwapFloat64();
        }
        else
        {
          return new PLYValueFloat64();
        }

      default:
        break;
    }
  }

  assert(false);

  return 0;
}